

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoint_approach.cpp
# Opt level: O0

pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> *
keypoint_compute(pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat>
                 *__return_storage_ptr__,Mat *img,ORB_Param *param)

{
  ORB *pOVar1;
  undefined8 uVar2;
  _OutputArray local_e8;
  _InputArray local_d0;
  Mat local_b8 [8];
  Mat descriptor;
  undefined1 local_58 [8];
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keypoint;
  Ptr<cv::ORB> local_30 [8];
  Ptr<cv::ORB> orb;
  ORB_Param *param_local;
  Mat *img_local;
  
  cv::ORB::create(0x3f99999a,local_30,500,8,0x1f,0,2,0,0x1f,0x14);
  pOVar1 = cv::Ptr<cv::ORB>::operator->(local_30);
  (**(code **)(*(long *)pOVar1 + 0x80))(pOVar1,param->nfeature);
  pOVar1 = cv::Ptr<cv::ORB>::operator->(local_30);
  (**(code **)(*(long *)pOVar1 + 0xb0))(pOVar1,param->edgeThreshold);
  pOVar1 = cv::Ptr<cv::ORB>::operator->(local_30);
  (**(code **)(*(long *)pOVar1 + 0xa0))(pOVar1,param->nlevels);
  pOVar1 = cv::Ptr<cv::ORB>::operator->(local_30);
  (**(code **)(*(long *)pOVar1 + 0x100))(pOVar1,param->fastThreshold);
  pOVar1 = cv::Ptr<cv::ORB>::operator->(local_30);
  (**(code **)(*(long *)pOVar1 + 0xf0))(pOVar1,param->patchSize);
  pOVar1 = cv::Ptr<cv::ORB>::operator->(local_30);
  (**(code **)(*(long *)pOVar1 + 0xd0))(pOVar1,param->WTA_K);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_58);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::reserve
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_58,(long)param->nfeature);
  cv::Mat::Mat(local_b8);
  pOVar1 = cv::Ptr<cv::ORB>::operator->(local_30);
  cv::_InputArray::_InputArray(&local_d0,img);
  uVar2 = cv::noArray();
  cv::_OutputArray::_OutputArray(&local_e8,local_b8);
  (**(code **)(*(long *)pOVar1 + 0x60))(pOVar1,&local_d0,uVar2,local_58,&local_e8,0);
  cv::_OutputArray::~_OutputArray(&local_e8);
  cv::_InputArray::~_InputArray(&local_d0);
  std::pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat>::
  pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat,_true>
            (__return_storage_ptr__,(vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_58,
             local_b8);
  cv::Mat::~Mat(local_b8);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_58);
  cv::Ptr<cv::ORB>::~Ptr(local_30);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<cv::KeyPoint>, cv::Mat> keypoint_compute(const cv::Mat& img, const ORB_Param& param)
{
#if CV_MAJOR_VERSION < 3
    auto orb = std::make_unique<cv::ORB>(param.nfeature, 1.2f, param.nlevels, param.edgeThreshold, 0, param.WTA_K,
        cv::ORB::HARRIS_SCORE, param.patchSize);
#else
    auto orb = cv::ORB::create();

    orb->setMaxFeatures(param.nfeature);
    orb->setEdgeThreshold(param.edgeThreshold);
    orb->setNLevels(param.nlevels);
    orb->setFastThreshold(param.fastThreshold);
    orb->setPatchSize(param.patchSize);
    orb->setWTA_K(param.WTA_K);
#endif

    std::vector<cv::KeyPoint> keypoint;
    keypoint.reserve(param.nfeature);
    cv::Mat descriptor;
#if CV_MAJOR_VERSION < 3
    orb->detect(img, keypoint);
    orb->compute(img, keypoint, descriptor);
#else
    orb->detectAndCompute(img, cv::noArray(), keypoint, descriptor, false);
#endif
    return {std::move(keypoint), std::move(descriptor)};
}